

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_map.c
# Opt level: O0

apx_file_t * apx_fileMap_find_by_address(apx_fileMap_t *self,uint32_t address)

{
  apx_file_t *self_00;
  _Bool _Var1;
  apx_file_t *file;
  adt_list_elem_t *pIter;
  apx_file_t *retval;
  uint32_t address_local;
  apx_fileMap_t *self_local;
  
  pIter = (adt_list_elem_t *)0x0;
  if (self != (apx_fileMap_t *)0x0) {
    if ((self->last_file != (apx_file_t *)0x0) &&
       (_Var1 = apx_file_address_in_range(self->last_file,address), _Var1)) {
      pIter = (adt_list_elem_t *)self->last_file;
    }
    if (pIter == (adt_list_elem_t *)0x0) {
      for (file = (apx_file_t *)adt_list_iter_first(&self->file_list); file != (apx_file_t *)0x0;
          file = (apx_file_t *)adt_list_iter_next((adt_list_elem_t *)file)) {
        self_00 = *(apx_file_t **)&(file->file_info).rmf_file_type;
        if (self_00 == (apx_file_t *)0x0) {
          __assert_fail("file != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/file_map.c"
                        ,0xa0,"apx_file_t *apx_fileMap_find_by_address(apx_fileMap_t *, uint32_t)");
        }
        _Var1 = apx_file_address_in_range(self_00,address);
        if (_Var1) {
          self->last_file = self_00;
          return self_00;
        }
      }
    }
  }
  return (apx_file_t *)pIter;
}

Assistant:

apx_file_t* apx_fileMap_find_by_address(apx_fileMap_t* self, uint32_t address)
{
   apx_file_t *retval = NULL;
   if (self != NULL)
   {
      if (self->last_file != NULL)
      {
         if (apx_file_address_in_range(self->last_file, address))
         {
            retval = self->last_file;
         }
      }
      if (retval == NULL)
      {
         adt_list_elem_t *pIter = adt_list_iter_first(&self->file_list);
         while(pIter != NULL)
         {
            apx_file_t *file = (apx_file_t*) pIter->pItem;
            assert(file != NULL);
            if (apx_file_address_in_range(file, address))
            {
               self->last_file = retval = file;
               break;
            }
            pIter = adt_list_iter_next(pIter);
         }
      }
   }
   return retval;
}